

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  uint in_EDI;
  uint local_8 [2];
  
  local_8[1] = 0;
  local_8[0] = in_EDI;
  InitUTF8CLI((int *)local_8,in_RSI);
  iVar1 = (**toktx.super_scApp.super_ktxApp._vptr_ktxApp)(&toktx,(ulong)local_8[0],in_RSI);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    InitUTF8CLI(argc, argv);
#if 0
    if (!SetConsoleOutputCP(CP_UTF8)) {
        cerr << theApp.getName() << "warning: failed to set UTF-8 code page for console output."
             << endl;
    }
#endif
    return theApp.main(argc, argv);
}